

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O2

void __thiscall
Buffer_change_event_remove_buffer_Test::TestBody(Buffer_change_event_remove_buffer_Test *this)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  initializer_list<bfy_changed_cb_info> __l;
  allocator_type local_2c1;
  size_t i;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_2;
  bfy_changed_cb_info local_288;
  BufferWithReadonlyStrings tgt;
  AssertionResult gtest_ar;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_108;
  BufferWithReadonlyStrings local;
  
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  tgt.buf.page.data =
       (int8_t *)anon_unknown.dwarf_1862d::buffer_count_pages(&local.buf,0xffffffffffffffff);
  testing::internal::CmpHelperLT<int,unsigned_long>
            ((internal *)&gtest_ar,"1","buffer_count_pages(&local.buf)",(int *)&gtest_ar_1,
             (unsigned_long *)&tgt);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tgt);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x5ef,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&tgt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (tgt.buf.page.data != (int8_t *)0x0) {
      (**(code **)(*(long *)tgt.buf.page.data + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  i = 1;
  sVar2 = bfy_buffer_get_content_len(&local.buf);
  for (; i < sVar2; i = i + 1) {
    anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
              ((BufferWithReadonlyStrings *)&gtest_ar);
    sVar1 = i;
    anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::start_listening_to_changes
              ((BufferWithReadonlyStrings *)&gtest_ar);
    anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&tgt);
    local_288.orig_size = bfy_buffer_remove_buffer((bfy_buffer *)&gtest_ar,i,&tgt.buf);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_1,"i","bfy_buffer_remove_buffer(&mabel.buf, i, &tgt.buf)",&i,
               &local_288.orig_size);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_288);
      pcVar3 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x5fb,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_288);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      if ((long *)local_288.orig_size != (long *)0x0) {
        (**(code **)(*(long *)local_288.orig_size + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    local_288.n_added = 0;
    local_288.n_deleted = sVar1;
    __l._M_len = 1;
    __l._M_array = &local_288;
    local_288.orig_size = sVar2;
    std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
              ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)&gtest_ar_1,__l,
               &local_2c1);
    testing::internal::
    CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
              ((internal *)&gtest_ar_2,"changes_t{expected}","mabel.changes",
               (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)&gtest_ar_1,
               &local_108);
    std::_Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::~_Vector_base
              ((_Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
               &gtest_ar_1);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar3 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_2.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_288,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x5fc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_288,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_288);
      if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&tgt);
    anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
              ((BufferWithReadonlyStrings *)&gtest_ar);
  }
  anon_unknown.dwarf_1862d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local);
  return;
}

Assistant:

TEST(Buffer, change_event_remove_buffer) {
    BufferWithReadonlyStrings const local;
    // confirm this test exercises removing <1, ==1, and >1 pages
    EXPECT_LT(1, buffer_count_pages(&local.buf));

    for (size_t i=1, n=bfy_buffer_get_content_len(&local.buf); i < n; ++i) {
        BufferWithReadonlyStrings mabel;
        auto const expected = bfy_changed_cb_info {
            .orig_size = n,
            .n_added = 0,
            .n_deleted = i
        };

        mabel.start_listening_to_changes();
        BufferWithReadonlyStrings tgt;
        EXPECT_EQ(i, bfy_buffer_remove_buffer(&mabel.buf, i, &tgt.buf));
        EXPECT_EQ(changes_t{expected}, mabel.changes);
    }
}